

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O0

TimerImpl * __thiscall
PoolList<Server::Private::TimerImpl>::linkFreeItem
          (PoolList<Server::Private::TimerImpl> *this,TimerImpl *t)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *insertPos;
  Item *item;
  TimerImpl *t_local;
  PoolList<Server::Private::TimerImpl> *this_local;
  
  pIVar1 = this->freeItem;
  this->freeItem = pIVar1->prev;
  pIVar2 = (this->_end).item;
  pIVar3 = pIVar2->prev;
  pIVar1->prev = pIVar3;
  if (pIVar3 == (Item *)0x0) {
    (this->_begin).item = pIVar1;
  }
  else {
    pIVar2->prev->next = pIVar1;
  }
  pIVar1->next = pIVar2;
  pIVar2->prev = pIVar1;
  this->_size = this->_size + 1;
  return t;
}

Assistant:

T& linkFreeItem(T* t)
  {
    Item* item = freeItem;
    freeItem = item->prev;
    Item* insertPos = _end.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;
    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return *t;
  }